

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

int mwRelink(mwData *mw,char *file,int line)

{
  size_t sVar1;
  mwData *pmVar2;
  bool bVar3;
  int iVar4;
  mwStat *pmVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  mwData *pmVar12;
  long lVar13;
  mwData *pmVar14;
  
  pcVar10 = "unknown";
  if (file != (char *)0x0) {
    pcVar10 = file;
  }
  if (mw == (mwData *)0x0) {
    mwWrite("relink: cannot repair MW at NULL\n");
LAB_00108ef0:
    mwFlush();
    if (mwTail == (mwData *)0x0 && mwHead == (mwData *)0x0) {
      pcVar9 = "relink: <%ld> %s(%d) heap damaged beyond repair\n";
      if (mwStatCurAlloc == 0) {
        pcVar9 = "relink: <%ld> %s(%d) heap is empty, nothing to repair\n";
      }
      mwWrite(pcVar9,mwCounter,pcVar10,(ulong)(uint)line);
      mwFlush();
      return 0;
    }
    uVar8 = 0;
    mwWrite("relink: <%ld> %s(%d) attempting emergency repairs...\n",mwCounter,pcVar10,
            (ulong)(uint)line);
    mwFlush();
    if (mwTail == (mwData *)0x0 || mwHead == (mwData *)0x0) {
      if (mwHead == (mwData *)0x0) {
        pcVar10 = "relink: mwHead is NULL, but mwTail is %p\n";
        pmVar12 = mwTail;
      }
      else {
        pcVar10 = "relink: mwTail is NULL, but mwHead is %p\n";
        pmVar12 = mwHead;
      }
      mwWrite(pcVar10,pmVar12);
      if (mwHead != (mwData *)0x0) goto LAB_00108fb1;
LAB_001090a7:
      pmVar12 = (mwData *)0x0;
    }
    else {
LAB_00108fb1:
      if (mwDataSize != '\0') {
        uVar8 = 0x38;
      }
      iVar4 = mwIsReadAddr(mwHead,uVar8);
      if ((iVar4 == 0) ||
         ((mwHead->count ^ mwHead->check ^ mwHead->size ^ (long)mwHead->line) != 0xfe0180)) {
        pmVar12 = (mwData *)0x0;
        mwWrite("relink: mwHead (MW-%p) is damaged, skipping forward scan\n");
        mwHead = (mwData *)0x0;
      }
      else {
        pmVar14 = mwHead;
        if (mwHead->prev != (mwData *)0x0) {
          pmVar12 = (mwData *)0x0;
          mwWrite("relink: the mwHead pointer\'s \'prev\' member is %p, not NULL\n",mwHead->prev);
          pmVar14 = mwHead;
          if (mwHead == (mwData *)0x0) goto LAB_001091ec;
        }
        while( true ) {
          pmVar12 = pmVar14;
          if (pmVar12->next == (mwData *)0x0) goto LAB_001090a7;
          uVar8 = 0;
          if (mwDataSize != '\0') {
            uVar8 = 0x38;
          }
          iVar4 = mwIsReadAddr(pmVar12->next,uVar8);
          if (iVar4 == 0) break;
          pmVar14 = pmVar12->next;
          uVar7 = pmVar12->size;
          uVar11 = (ulong)pmVar12->line;
          if (((uVar11 ^ uVar7 ^ (ulong)(pmVar14->check == 0) ^ pmVar12->count) != 0xfe0180) ||
             (pmVar14->prev != pmVar12)) goto LAB_001090ec;
        }
        uVar7 = pmVar12->size;
        uVar11 = (ulong)(uint)pmVar12->line;
LAB_001090ec:
        pcVar9 = "NoMansLand ";
        pcVar10 = "NoMansLand ";
        if ((mw->flag & 1) == 0) {
          pcVar10 = "";
        }
        mwWrite("relink: forward chain\'s last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",pmVar12,
                uVar7,pcVar10,pmVar12->file,uVar11);
        uVar8 = 0x38;
        if (mwDataSize == '\0') {
          uVar8 = 0;
        }
        iVar4 = mwIsReadAddr(pmVar12->next,uVar8);
        if (iVar4 == 0) {
          mwWrite("relink: the \'next\' pointer of this MW points to %p, which is out-of-legal-access\n"
                  ,pmVar12->next);
        }
        else {
          pmVar14 = pmVar12->next;
          sVar1 = pmVar12->size;
          if ((mw->flag & 1) == 0) {
            pcVar9 = "";
          }
          iVar4 = mwIsReadAddr(pmVar12->file,0x10);
          if (iVar4 == 0) {
            pcVar10 = "<garbage-pointer>";
          }
          else {
            pcVar10 = pmVar12->file;
          }
          mwWrite("relink: forward chain\'s first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
                  pmVar14,sVar1,pcVar9,pcVar10,(ulong)(uint)pmVar12->line);
        }
      }
    }
LAB_001091ec:
    pmVar14 = (mwData *)0x0;
    uVar8 = 0;
    if (mwTail != (mwData *)0x0) {
      if (mwDataSize != '\0') {
        uVar8 = 0x38;
      }
      iVar4 = mwIsReadAddr(mwTail,uVar8);
      if ((iVar4 == 0) ||
         ((mwTail->count ^ mwTail->check ^ mwTail->size ^ (long)mwTail->line) != 0xfe0180)) {
        pmVar14 = (mwData *)0x0;
        mwWrite("relink: mwTail (%p) is damaged, skipping reverse scan\n");
        mwTail = (mwData *)0x0;
      }
      else {
        pmVar2 = mwTail;
        if (mwTail->next != (mwData *)0x0) {
          pmVar14 = (mwData *)0x0;
          mwWrite("relink: the mwTail pointer\'s \'next\' member is %p, not NULL\n",mwTail->next);
          pmVar2 = mwTail;
          if (mwTail == (mwData *)0x0) goto LAB_001092f8;
        }
        while( true ) {
          pmVar14 = pmVar2;
          if (pmVar14->prev == (mwData *)0x0) {
            pmVar14 = (mwData *)0x0;
            goto LAB_001092f8;
          }
          uVar8 = 0;
          if (mwDataSize != '\0') {
            uVar8 = 0x38;
          }
          iVar4 = mwIsReadAddr(pmVar14->prev,uVar8);
          if (iVar4 == 0) break;
          pmVar2 = pmVar14->prev;
          uVar7 = pmVar14->size;
          uVar11 = (ulong)pmVar14->line;
          if (((uVar11 ^ uVar7 ^ (ulong)(pmVar2->check == 0) ^ pmVar14->count) != 0xfe0180) ||
             (pmVar2->next != pmVar14)) goto LAB_001094b8;
        }
        uVar7 = pmVar14->size;
        uVar11 = (ulong)(uint)pmVar14->line;
LAB_001094b8:
        pcVar9 = "NoMansLand ";
        pcVar10 = "NoMansLand ";
        if ((mw->flag & 1) == 0) {
          pcVar10 = "";
        }
        mwWrite("relink: reverse chain\'s last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",pmVar14,
                uVar7,pcVar10,pmVar14->file,uVar11);
        uVar8 = 0x38;
        if (mwDataSize == '\0') {
          uVar8 = 0;
        }
        iVar4 = mwIsReadAddr(pmVar14->prev,uVar8);
        if (iVar4 == 0) {
          mwWrite("relink: the \'prev\' pointer of this MW points to %p, which is out-of-legal-access\n"
                  ,pmVar14->prev);
        }
        else {
          pmVar2 = pmVar14->prev;
          sVar1 = pmVar14->size;
          if ((mw->flag & 1) == 0) {
            pcVar9 = "";
          }
          iVar4 = mwIsReadAddr(pmVar14->file,0x10);
          if (iVar4 == 0) {
            pcVar10 = "<garbage-pointer>";
          }
          else {
            pcVar10 = pmVar14->file;
          }
          mwWrite("relink: reverse chain\'s first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
                  pmVar2,sVar1,pcVar9,pcVar10,(ulong)(uint)pmVar14->line);
        }
      }
    }
LAB_001092f8:
    if (mwHead == (mwData *)0x0 && mwTail == (mwData *)0x0) {
      pcVar10 = "relink: both head and tail pointers damaged, aborting program\n";
      goto LAB_00109583;
    }
    if (mwHead == (mwData *)0x0) {
      pmVar12 = (mwData *)0x0;
      mwHead = pmVar14;
      mwWrite("relink: heap truncated, MW-%p designated as new mwHead\n",pmVar14);
      pmVar14->prev = (mwData *)0x0;
      pmVar14 = (mwData *)0x0;
    }
    if (mwTail == (mwData *)0x0) {
      pmVar14 = (mwData *)0x0;
      mwTail = pmVar12;
      mwWrite("relink: heap truncated, MW-%p designated as new mwTail\n",pmVar12);
      pmVar12->next = (mwData *)0x0;
      pmVar12 = (mwData *)0x0;
    }
    if (pmVar12 == (mwData *)0x0 && pmVar14 == (mwData *)0x0) {
      if ((mwHead->prev != (mwData *)0x0) || (mwTail->next != (mwData *)0x0)) {
LAB_0010956a:
        pcVar10 = "relink: heap totally destroyed, aborting program\n";
        goto LAB_00109583;
      }
      pcVar10 = "relink: verifying heap integrity...\n";
    }
    else {
      if (((pmVar14 == (mwData *)0x0) || (pmVar12 == pmVar14)) || (pmVar12 == (mwData *)0x0))
      goto LAB_0010956a;
      pmVar12->next = pmVar14;
      pmVar14->prev = pmVar12;
      pcVar10 = "relink: emergency repairs successful, assessing damage...\n";
    }
    mwWrite(pcVar10);
LAB_001093d2:
    mwFlush();
  }
  else {
    uVar8 = 0x38;
    if (mwDataSize == '\0') {
      uVar8 = 0;
    }
    iVar4 = mwIsSafeAddr(mw,uVar8);
    if (iVar4 == 0) {
      pcVar9 = "relink: MW-%p is a garbage pointer\n";
LAB_00108ee6:
      mwWrite(pcVar9,mw);
      goto LAB_00108ef0;
    }
    uVar8 = 0;
    mwWrite("relink: <%ld> %s(%d) attempting to repair MW-%p...\n",mwCounter,pcVar10,
            (ulong)(uint)line,mw);
    mwFlush();
    if (mwHead != mw) {
      if (mwDataSize != '\0') {
        uVar8 = 0x38;
      }
      iVar4 = mwIsSafeAddr(mwHead,uVar8);
      if (iVar4 != 0) {
        pmVar12 = mwHead;
        if (mwHead == (mwData *)0x0) {
LAB_00108df0:
          mwWrite("relink: MW-%p not found in forward chain search\n",mw);
          mwFlush();
          bVar3 = true;
          goto LAB_00108e11;
        }
        do {
          pmVar14 = pmVar12;
          pmVar12 = pmVar14->next;
          if (pmVar12 == mw) {
            mw->prev = pmVar14;
            bVar3 = false;
            goto LAB_00108e11;
          }
          if (pmVar12 == (mwData *)0x0) goto LAB_00108df0;
          uVar8 = 0;
          if (mwDataSize != '\0') {
            uVar8 = 0x38;
          }
          iVar4 = mwIsSafeAddr(pmVar12,uVar8);
        } while ((iVar4 != 0) && (pmVar12 = pmVar14->next, pmVar14->next->prev == pmVar14));
        pcVar9 = "relink: failed for MW-%p; forward chain fragmented at MW-%p: \'next\' is %p\n";
LAB_00108e96:
        mwWrite(pcVar9,mw,pmVar14);
        goto LAB_00108ef0;
      }
      pcVar9 = "relink: failed for MW-%p; head pointer destroyed\n";
      goto LAB_00108ee6;
    }
    bVar3 = false;
    mwWrite("relink: MW-%p is the head (first) allocation\n",mw);
    if (mw->prev != (mwData *)0x0) {
      bVar3 = false;
      mwWrite("relink: MW-%p prev pointer is non-NULL, you have a wild pointer\n",mw);
      mw->prev = (mwData *)0x0;
    }
LAB_00108e11:
    if (mwTail != mw) {
      uVar8 = 0x38;
      if (mwDataSize == '\0') {
        uVar8 = 0;
      }
      iVar4 = mwIsSafeAddr(mwTail,uVar8);
      if (iVar4 == 0) {
        pcVar9 = "relink: failed for MW-%p; tail pointer destroyed\n";
        goto LAB_00108ee6;
      }
      pmVar12 = mwTail;
      if (mwTail != (mwData *)0x0) {
        do {
          pmVar14 = pmVar12;
          pmVar12 = pmVar14->prev;
          if (pmVar12 == mw) {
            mw->next = pmVar14;
            goto LAB_0010917a;
          }
          if (pmVar12 == (mwData *)0x0) goto LAB_001090af;
          uVar8 = 0;
          if (mwDataSize != '\0') {
            uVar8 = 0x38;
          }
          iVar4 = mwIsSafeAddr(pmVar12,uVar8);
        } while ((iVar4 != 0) && (pmVar12 = pmVar14->prev, pmVar14->prev->next == pmVar14));
        pcVar9 = "relink: failed for MW-%p; reverse chain fragmented at MW-%p, \'prev\' is %p\n";
        goto LAB_00108e96;
      }
LAB_001090af:
      mwWrite("relink: MW-%p not found in reverse chain search\n",mw);
      mwFlush();
      if (!bVar3) goto LAB_0010917a;
      mwWrite("relink: heap appears intact, MW-%p probably garbage pointer\n",mw);
      goto LAB_001093d2;
    }
    mwWrite("relink: MW-%p is the tail (last) allocation\n",mw);
    if (mw->next != (mwData *)0x0) {
      mwWrite("relink: MW-%p next pointer is non-NULL, you have a wild pointer\n",mw);
      mw->next = (mwData *)0x0;
    }
LAB_0010917a:
    iVar4 = mwIsReadAddr(mw->file,1);
    if ((iVar4 != 0) && (pmVar5 = mwStatGet(mw->file,-1,0), pmVar5 == (mwStat *)0x0)) {
      mw->file = "<relinked>";
    }
    mw->check = mw->count ^ mw->size ^ (long)mw->line ^ 0xfe0180;
  }
  iVar4 = mwIsHeapOK((mwData *)0x0);
  if (iVar4 != 0) {
    if (mwHead == (mwData *)0x0) {
      lVar6 = 0;
      lVar13 = 0;
    }
    else {
      lVar13 = 0;
      lVar6 = 0;
      pmVar12 = mwHead;
      do {
        lVar6 = lVar6 + 1;
        lVar13 = lVar13 + pmVar12->size;
        pmVar12 = pmVar12->next;
      } while (pmVar12 != (mwData *)0x0);
    }
    if (mwNumCurAlloc - lVar6 == 0) {
      mwWrite("relink: successful, ");
      if (lVar13 == mwStatCurAlloc) {
        mwWrite("no allocations lost\n");
        iVar4 = 1;
      }
      else {
        iVar4 = 1;
        if (mw != (mwData *)0x0) {
          mwWrite("size information lost for MW-%p\n",mw);
          mw->size = 0;
        }
      }
    }
    else {
      iVar4 = 0;
      mwWrite("relink: partial, %ld MW-blocks of %ld bytes lost\n",
              (mwNumCurAlloc - lVar6) + mwNmlNumAlloc,(mwNmlCurAlloc - lVar13) + mwStatCurAlloc);
    }
    return iVar4;
  }
  pcVar10 = "relink: heap verification FAILS - aborting program\n";
LAB_00109583:
  mwWrite(pcVar10);
  mwFlushingB2 = 1;
  mwFlushingB1 = 1;
  mwFlushing = 1;
  mwFlush();
  abort();
}

Assistant:

static int mwRelink(mwData *mw, const char *file, int line)
{
	int fails;
	mwData *mw1, *mw2;
	long count, size;
	mwStat *ms;

	if (file == NULL) {
		file = "unknown";
	}

	if (mw == NULL) {
		mwWrite("relink: cannot repair MW at NULL\n");
		FLUSH();
		goto emergency;
	}

	if (!mwIsSafeAddr(mw, mwDataSize)) {
		mwWrite("relink: MW-%p is a garbage pointer\n", mw);
		FLUSH();
		goto emergency;
	}

	mwWrite("relink: <%ld> %s(%d) attempting to repair MW-%p...\n", mwCounter, file, line, mw);
	FLUSH();
	fails = 0;

	/* Repair from head */
	if (mwHead != mw) {
		if (!mwIsSafeAddr(mwHead, mwDataSize)) {
			mwWrite("relink: failed for MW-%p; head pointer destroyed\n", mw);
			FLUSH();
			goto emergency;
		}
		for (mw1 = mwHead; mw1; mw1 = mw1->next) {
			if (mw1->next == mw) {
				mw->prev = mw1;
				break;
			}
			if (mw1->next &&
				(!mwIsSafeAddr(mw1->next, mwDataSize) || mw1->next->prev != mw1)) {
				mwWrite("relink: failed for MW-%p; forward chain fragmented at MW-%p: 'next' is %p\n", mw, mw1, mw1->next);
				FLUSH();
				goto emergency;
			}
		}
		if (mw1 == NULL) {
			mwWrite("relink: MW-%p not found in forward chain search\n", mw);
			FLUSH();
			fails ++;
		}
	} else {
		mwWrite("relink: MW-%p is the head (first) allocation\n", mw);
		if (mw->prev != NULL) {
			mwWrite("relink: MW-%p prev pointer is non-NULL, you have a wild pointer\n", mw);
			mw->prev = NULL;
		}
	}

	/* Repair from tail */
	if (mwTail != mw) {
		if (!mwIsSafeAddr(mwTail, mwDataSize)) {
			mwWrite("relink: failed for MW-%p; tail pointer destroyed\n", mw);
			FLUSH();
			goto emergency;
		}
		for (mw1 = mwTail; mw1; mw1 = mw1->prev) {
			if (mw1->prev == mw) {
				mw->next = mw1;
				break;
			}
			if (mw1->prev && (!mwIsSafeAddr(mw1->prev, mwDataSize) || mw1->prev->next != mw1)) {
				mwWrite("relink: failed for MW-%p; reverse chain fragmented at MW-%p, 'prev' is %p\n", mw, mw1, mw1->prev);
				FLUSH();
				goto emergency;
			}
		}
		if (mw1 == NULL) {
			mwWrite("relink: MW-%p not found in reverse chain search\n", mw);
			FLUSH();
			fails ++;
		}
	} else {
		mwWrite("relink: MW-%p is the tail (last) allocation\n", mw);
		if (mw->next != NULL) {
			mwWrite("relink: MW-%p next pointer is non-NULL, you have a wild pointer\n", mw);
			mw->next = NULL;
		}
	}

	if (fails > 1) {
		mwWrite("relink: heap appears intact, MW-%p probably garbage pointer\n", mw);
		FLUSH();
		goto verifyok;
	}

	/* restore MW info where possible */
	if (mwIsReadAddr(mw->file, 1)) {
		ms = mwStatGet(mw->file, -1, 0);
		if (ms == NULL) {
			mw->file = "<relinked>";
		}
	}
	mw->check = CHKVAL(mw);
	goto verifyok;

	/* Emergency repair */
emergency:

	if (mwHead == NULL && mwTail == NULL) {
		if (mwStatCurAlloc == 0) {
			mwWrite("relink: <%ld> %s(%d) heap is empty, nothing to repair\n", mwCounter, file, line);
		} else {
			mwWrite("relink: <%ld> %s(%d) heap damaged beyond repair\n", mwCounter, file, line);
		}
		FLUSH();
		return 0;
	}

	mwWrite("relink: <%ld> %s(%d) attempting emergency repairs...\n", mwCounter, file, line);
	FLUSH();

	if (mwHead == NULL || mwTail == NULL) {
		if (mwHead == NULL) {
			mwWrite("relink: mwHead is NULL, but mwTail is %p\n", mwTail);
		} else {
			mwWrite("relink: mwTail is NULL, but mwHead is %p\n", mwHead);
		}
	}

	mw1 = NULL;
	if (mwHead != NULL) {
		if (!mwIsReadAddr(mwHead, mwDataSize) || mwHead->check != CHKVAL(mwHead)) {
			mwWrite("relink: mwHead (MW-%p) is damaged, skipping forward scan\n", mwHead);
			mwHead = NULL;
			goto scan_reverse;
		}
		if (mwHead->prev != NULL) {
			mwWrite("relink: the mwHead pointer's 'prev' member is %p, not NULL\n", mwHead->prev);
		}
		for (mw1 = mwHead; mw1; mw1 = mw1->next) {
			if (mw1->next) {
				if (!mwIsReadAddr(mw1->next, mwDataSize) ||
					(!mw1->next->check) != CHKVAL(mw1) ||
					mw1->next->prev != mw1) {
					mwWrite("relink: forward chain's last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
							mw1, mw1->size, (mw->flag & MW_NML) ? "NoMansLand " : "", mw1->file, mw1->line);
					if (mwIsReadAddr(mw1->next, mwDataSize)) {
						mwWrite("relink: forward chain's first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
								mw1->next, mw1->size, (mw->flag & MW_NML) ? "NoMansLand " : "",
								mwIsReadAddr(mw1->file, 16) ? mw1->file : "<garbage-pointer>", mw1->line);
					} else {
						mwWrite("relink: the 'next' pointer of this MW points to %p, which is out-of-legal-access\n",
								mw1->next);
					}
					break;
				}
			}
		}
	}


scan_reverse:
	mw2 = NULL;
	if (mwTail != NULL) {
		if (!mwIsReadAddr(mwTail, mwDataSize) || mwTail->check != CHKVAL(mwTail)) {
			mwWrite("relink: mwTail (%p) is damaged, skipping reverse scan\n", mwTail);
			mwTail = NULL;
			goto analyze;
		}
		if (mwTail->next != NULL) {
			mwWrite("relink: the mwTail pointer's 'next' member is %p, not NULL\n", mwTail->next);
		}
		for (mw2 = mwTail; mw2; mw2 = mw2->prev) {
			if (mw2->prev) {
				if (!mwIsReadAddr(mw2->prev, mwDataSize) ||
					(!mw2->prev->check) != CHKVAL(mw2) ||
					mw2->prev->next != mw2) {
					mwWrite("relink: reverse chain's last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
							mw2, mw2->size, (mw->flag & MW_NML) ? "NoMansLand " : "", mw2->file, mw2->line);
					if (mwIsReadAddr(mw2->prev, mwDataSize)) {
						mwWrite("relink: reverse chain's first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
								mw2->prev, mw2->size, (mw->flag & MW_NML) ? "NoMansLand " : "",
								mwIsReadAddr(mw2->file, 16) ? mw2->file : "<garbage-pointer>", mw2->line);
					} else {
						mwWrite("relink: the 'prev' pointer of this MW points to %p, which is out-of-legal-access\n",
								mw2->prev);
					}
					break;
				}
			}
		}
	}

analyze:
	if (mwHead == NULL && mwTail == NULL) {
		mwWrite("relink: both head and tail pointers damaged, aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}
	if (mwHead == NULL) {
		mwHead = mw2;
		mwWrite("relink: heap truncated, MW-%p designated as new mwHead\n", mw2);
		mw2->prev = NULL;
		mw1 = mw2 = NULL;
	}
	if (mwTail == NULL) {
		mwTail = mw1;
		mwWrite("relink: heap truncated, MW-%p designated as new mwTail\n", mw1);
		mw1->next = NULL;
		mw1 = mw2 = NULL;
	}
	if (mw1 == NULL && mw2 == NULL &&
		mwHead->prev == NULL && mwTail->next == NULL) {
		mwWrite("relink: verifying heap integrity...\n");
		FLUSH();
		goto verifyok;
	}
	if (mw1 && mw2 && mw1 != mw2) {
		mw1->next = mw2;
		mw2->prev = mw1;
		mwWrite("relink: emergency repairs successful, assessing damage...\n");
		FLUSH();
	} else {
		mwWrite("relink: heap totally destroyed, aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}

	/* Verify by checking that the number of active allocations */
	/* match the number of entries in the chain */
verifyok:
	if (!mwIsHeapOK(NULL)) {
		mwWrite("relink: heap verification FAILS - aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}
	for (size = count = 0, mw1 = mwHead; mw1; mw1 = mw1->next) {
		count ++;
		size += (long) mw1->size;
	}
	if (count == mwNumCurAlloc) {
		mwWrite("relink: successful, ");
		if (size == mwStatCurAlloc) {
			mwWrite("no allocations lost\n");
		} else {
			if (mw != NULL) {
				mwWrite("size information lost for MW-%p\n", mw);
				mw->size = 0;
			}
		}
	} else {
		mwWrite("relink: partial, %ld MW-blocks of %ld bytes lost\n",
				mwNmlNumAlloc + mwNumCurAlloc - count, mwNmlCurAlloc + mwStatCurAlloc - size);
		return 0;
	}

	return 1;
}